

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void zng_tr_flush_bits(deflate_state *s)

{
  uint uVar1;
  long in_RDI;
  uint32_t dw;
  
  dw = (uint32_t)((ulong)in_RDI >> 0x20);
  if (*(int *)(in_RDI + 0x1780) < 0x30) {
    if (0x1f < *(int *)(in_RDI + 0x1780)) {
      put_uint32(s,dw);
      *(ulong *)(in_RDI + 0x1778) = *(ulong *)(in_RDI + 0x1778) >> 0x20;
      *(int *)(in_RDI + 0x1780) = *(int *)(in_RDI + 0x1780) + -0x20;
    }
  }
  else {
    put_uint32(s,dw);
    put_short(s,(uint16_t)((ulong)in_RDI >> 0x30));
    *(ulong *)(in_RDI + 0x1778) = *(ulong *)(in_RDI + 0x1778) >> 0x30;
    *(int *)(in_RDI + 0x1780) = *(int *)(in_RDI + 0x1780) + -0x30;
  }
  if (0xf < *(int *)(in_RDI + 0x1780)) {
    put_short(s,(uint16_t)((ulong)in_RDI >> 0x30));
    *(ulong *)(in_RDI + 0x1778) = *(ulong *)(in_RDI + 0x1778) >> 0x10;
    *(int *)(in_RDI + 0x1780) = *(int *)(in_RDI + 0x1780) + -0x10;
  }
  if (7 < *(int *)(in_RDI + 0x1780)) {
    uVar1 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar1 + 1;
    *(char *)(*(long *)(in_RDI + 8) + (ulong)uVar1) = (char)*(undefined8 *)(in_RDI + 0x1778);
    *(ulong *)(in_RDI + 0x1778) = *(ulong *)(in_RDI + 0x1778) >> 8;
    *(int *)(in_RDI + 0x1780) = *(int *)(in_RDI + 0x1780) + -8;
  }
  return;
}

Assistant:

void Z_INTERNAL zng_tr_flush_bits(deflate_state *s) {
    if (s->bi_valid >= 48) {
        put_uint32(s, (uint32_t)s->bi_buf);
        put_short(s, (uint16_t)(s->bi_buf >> 32));
        s->bi_buf >>= 48;
        s->bi_valid -= 48;
    } else if (s->bi_valid >= 32) {
        put_uint32(s, (uint32_t)s->bi_buf);
        s->bi_buf >>= 32;
        s->bi_valid -= 32;
    }
    if (s->bi_valid >= 16) {
        put_short(s, (uint16_t)s->bi_buf);
        s->bi_buf >>= 16;
        s->bi_valid -= 16;
    }
    if (s->bi_valid >= 8) {
        put_byte(s, s->bi_buf);
        s->bi_buf >>= 8;
        s->bi_valid -= 8;
    }
}